

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

uint64_t t1ha_64be(void *data,size_t len,uint64_t seed)

{
  ulong uVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  ulong in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  uint64_t *v;
  uint64_t c13;
  uint64_t d02;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t *v_1;
  void *detent;
  uint64_t d;
  uint64_t c;
  uint64_t align [4];
  int need_align;
  uint64_t b;
  uint64_t a;
  ulong uVar10;
  undefined8 *local_b0;
  undefined8 *local_78;
  ulong local_68;
  uint64_t local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_2c;
  ulong local_28;
  ulong local_20;
  uint64_t local_18;
  ulong local_10;
  undefined8 *local_8;
  
  local_2c = 0;
  local_28 = in_RSI;
  local_20 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (0x20 < in_RSI) {
    local_18 = in_RDX;
    local_60 = rot64(in_RSI,0x11);
    local_68 = local_10;
    local_60 = local_60 + local_18;
    uVar2 = rot64(local_18,0x11);
    local_68 = local_68 ^ uVar2;
    puVar3 = (undefined8 *)((long)local_8 + (local_10 - 0x1f));
    do {
      local_78 = local_8;
      if (local_2c != 0) {
        local_58 = *local_8;
        local_50 = local_8[1];
        local_48 = local_8[2];
        local_40 = local_8[3];
        local_78 = &local_58;
      }
      uVar2 = fetch64_be(local_78);
      uVar4 = fetch64_be(local_78 + 1);
      uVar5 = fetch64_be(local_78 + 2);
      uVar6 = fetch64_be(local_78 + 3);
      uVar7 = rot64(uVar5 + local_68,0x11);
      uVar8 = rot64(uVar6 + local_60,0x11);
      uVar1 = local_20;
      uVar9 = rot64(uVar2,0x29);
      uVar10 = local_28;
      local_60 = (uVar1 ^ uVar9) + local_60;
      uVar9 = rot64(uVar4,0x1f);
      local_68 = local_68 - (uVar10 ^ uVar9);
      local_20 = ((uVar2 ^ uVar7) + uVar6) * -0x7dbcb016f12310c7 ^ local_20;
      local_28 = ((uVar4 ^ uVar8) + uVar5) * -0x136640f27c8d3555 ^ local_28;
      local_8 = local_8 + 4;
    } while (local_8 < puVar3);
    uVar2 = rot64(local_60,0x11);
    local_20 = (uVar2 + local_68) * -0x34a50ac51c5553cf ^ local_20;
    uVar2 = rot64(local_68,0x11);
    local_28 = (local_60 + uVar2) * -0x3f9f8db57bdb0cbb ^ local_28;
    local_10 = local_10 & 0x1f;
  }
  local_b0 = local_8;
  if ((local_2c != 0) && (8 < local_10)) {
    memcpy(&local_58,local_8,local_10);
    local_b0 = &local_58;
  }
  uVar10 = local_10;
  switch(local_10) {
  default:
    uVar2 = fetch64_be(local_b0);
    uVar2 = mux64(uVar2,0x9c06faf4d023e3ab);
    local_28 = uVar2 + local_28;
    local_b0 = local_b0 + 1;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    uVar2 = fetch64_be(local_b0);
    uVar2 = mux64(uVar2,0xbd9cacc22c6e9571);
    local_20 = uVar2 + local_20;
    local_b0 = local_b0 + 1;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    uVar2 = fetch64_be(local_b0);
    uVar2 = mux64(uVar2,0xd4f06db99d67be4b);
    local_28 = uVar2 + local_28;
    local_b0 = local_b0 + 1;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar2 = tail64_be(local_b0,local_10);
    uVar2 = mux64(uVar2,0x82434fe90edcef39);
    local_20 = uVar2 + local_20;
  case 0:
    uVar2 = rot64(local_20 + local_28,0x11);
    uVar2 = mux64(uVar2,0x9c06faf4d023e3ab);
    uVar4 = mix(uVar10,uVar2);
    return uVar2 + uVar4;
  }
}

Assistant:

uint64_t t1ha_64be(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  const int need_align = (((uintptr_t)data) & 7) != 0 && !UNALIGNED_OK;
  uint64_t align[4];

  if (unlikely(len > 32)) {
    uint64_t c = rot64(len, s1) + seed;
    uint64_t d = len ^ rot64(seed, s1);
    const void *detent = (const uint8_t *)data + len - 31;
    do {
      const uint64_t *v = (const uint64_t *)data;
      if (unlikely(need_align))
        v = (const uint64_t *)memcpy(&align, v, 32);

      uint64_t w0 = fetch64_be(v + 0);
      uint64_t w1 = fetch64_be(v + 1);
      uint64_t w2 = fetch64_be(v + 2);
      uint64_t w3 = fetch64_be(v + 3);

      uint64_t d02 = w0 ^ rot64(w2 + d, s1);
      uint64_t c13 = w1 ^ rot64(w3 + c, s1);
      c += a ^ rot64(w0, s0);
      d -= b ^ rot64(w1, s2);
      a ^= p1 * (d02 + w3);
      b ^= p0 * (c13 + w2);
      data = (const uint64_t *)data + 4;
    } while (likely(data < detent));

    a ^= p6 * (rot64(c, s1) + d);
    b ^= p5 * (c + rot64(d, s1));
    len &= 31;
  }

  const uint64_t *v = (const uint64_t *)data;
  if (unlikely(need_align) && len > 8)
    v = (const uint64_t *)memcpy(&align, v, len);

  switch (len) {
  default:
    b += mux64(fetch64_be(v++), p4);
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    a += mux64(fetch64_be(v++), p3);
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    b += mux64(fetch64_be(v++), p2);
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    a += mux64(tail64_be(v, len), p1);
  case 0:
    return mux64(rot64(a + b, s1), p4) + mix(a ^ b, p0);
  }
}